

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

BOOL CorUnix::CThreadSuspensionInfo::TryAcquireSuspensionLock(CPalThread *pthrTarget)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  int iPthreadRet;
  CPalThread *pthrTarget_local;
  
  __mutex = GetSuspensionMutex(&pthrTarget->suspensionInfo);
  uVar1 = pthread_mutex_trylock((pthread_mutex_t *)__mutex);
  if ((uVar1 != 0) && (uVar1 != 0x10)) {
    fprintf(_stderr,"] %s %s:%d","TryAcquireSuspensionLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0x166);
    fprintf(_stderr,
            "Expression: iPthreadRet == 0 || iPthreadRet == EBUSY, Description: pthread_mutex_trylock returned %d\n"
            ,(ulong)uVar1);
  }
  return (BOOL)(uVar1 == 0);
}

Assistant:

BOOL
CThreadSuspensionInfo::TryAcquireSuspensionLock(
    CPalThread* pthrTarget
    )
{
#if DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
{
    return pthrTarget->suspensionInfo.GetSuspensionSpinlock()->TryEnter();
}
#else // DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
{
    int iPthreadRet = pthread_mutex_trylock(pthrTarget->suspensionInfo.GetSuspensionMutex());
    _ASSERT_MSG(iPthreadRet == 0 || iPthreadRet == EBUSY, "pthread_mutex_trylock returned %d\n", iPthreadRet);
    // If iPthreadRet is 0, lock acquisition was successful. Otherwise, it failed.
    return (iPthreadRet == 0);
}
#endif // DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
}